

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::operator=
          (PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *this,
          TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *tr)

{
  Index newSize;
  StorageIndex *pSVar1;
  PermutationMatrix<_1,__1,_int> *pPVar2;
  undefined8 local_20;
  Index k;
  TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *tr_local;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this_local;
  
  newSize = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::size(tr);
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,newSize);
  local_20 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                       ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this);
  while (local_20 = local_20 + -1, -1 < local_20) {
    pSVar1 = TranspositionsBase<Eigen::Transpositions<-1,_-1,_int>_>::coeff(tr,local_20);
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,local_20,
               (long)*pSVar1);
  }
  pPVar2 = EigenBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::derived
                     ((EigenBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this);
  return pPVar2;
}

Assistant:

Derived& operator=(const TranspositionsBase<OtherDerived>& tr)
    {
      setIdentity(tr.size());
      for(Index k=size()-1; k>=0; --k)
        applyTranspositionOnTheRight(k,tr.coeff(k));
      return derived();
    }